

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessBuffersTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::DirectStateAccess::Buffers::ErrorsTest::TestErrorsOfCopyNamedBufferSubData(ErrorsTest *this)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  deUint32 dVar7;
  undefined4 extraout_var;
  byte bVar9;
  GLuint not_a_buffer_name;
  GLuint GVar10;
  GLuint buffer_w;
  GLuint buffer_r;
  byte local_3f;
  byte local_3e;
  byte local_3d;
  byte local_3c;
  byte local_3b;
  byte local_3a;
  byte local_39;
  byte local_38;
  byte local_37;
  byte local_36;
  byte local_35;
  GLubyte dummy_data [4];
  long lVar8;
  
  iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar6);
  buffer_r = 0;
  buffer_w = 0;
  dummy_data[0] = '\0';
  dummy_data[1] = '\0';
  dummy_data[2] = '\0';
  dummy_data[3] = '\0';
  (**(code **)(lVar8 + 0x3b8))(1);
  dVar7 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar7,"glCreateBuffers failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0xc57);
  (*this->m_pNamedBufferStorage)(buffer_r,4,dummy_data,0x43);
  dVar7 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar7,"glNamedBuffeStorage failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0xc5b);
  (**(code **)(lVar8 + 0x3b8))(1,&buffer_w);
  dVar7 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar7,"glCreateBuffers failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0xc5e);
  (*this->m_pNamedBufferStorage)(buffer_w,4,dummy_data,0x43);
  dVar7 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar7,"glNamedBuffeStorage failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0xc62);
  GVar10 = 0;
  do {
    GVar10 = GVar10 + 1;
    cVar1 = (**(code **)(lVar8 + 0xc68))(GVar10);
  } while (cVar1 != '\0');
  (*this->m_pCopyNamedBufferSubData)(GVar10,buffer_w,0,0,4);
  bVar2 = ErrorCheckAndLog(this,"glCopyNamedBufferSubData",0x502,
                           " if readBuffer is not the name of an existing buffer object.");
  (*this->m_pCopyNamedBufferSubData)(buffer_r,GVar10,0,0,4);
  local_35 = ErrorCheckAndLog(this,"glCopyNamedBufferSubData",0x502,
                              " if writeBuffer is not the name of an existing buffer object.");
  (*this->m_pCopyNamedBufferSubData)(buffer_r,buffer_w,-1,0,4);
  local_36 = ErrorCheckAndLog(this,"glCopyNamedBufferSubData",0x501,"if readOffset is negative.");
  (*this->m_pCopyNamedBufferSubData)(buffer_r,buffer_w,0,-1,4);
  local_37 = ErrorCheckAndLog(this,"glCopyNamedBufferSubData",0x501,"if writeOffset is negative.");
  (*this->m_pCopyNamedBufferSubData)(buffer_r,buffer_w,0,0,-1);
  local_38 = ErrorCheckAndLog(this,"glCopyNamedBufferSubData",0x501,"if size is negative.");
  (*this->m_pCopyNamedBufferSubData)(buffer_r,buffer_w,0,0,8);
  local_39 = ErrorCheckAndLog(this,"glCopyNamedBufferSubData",0x501,
                              " if size is greater than the size of the source buffer object.");
  (*this->m_pCopyNamedBufferSubData)(buffer_r,buffer_w,2,0,4);
  local_3a = ErrorCheckAndLog(this,"glCopyNamedBufferSubData",0x501,
                              " if readOffset+size is greater than the size of the source buffer object."
                             );
  (*this->m_pCopyNamedBufferSubData)(buffer_r,buffer_w,0,2,4);
  local_3b = ErrorCheckAndLog(this,"glCopyNamedBufferSubData",0x501,
                              " if writeOffset+size is greater than the size of the source buffer object."
                             );
  (*this->m_pCopyNamedBufferSubData)(buffer_w,buffer_w,0,0,4);
  local_3c = ErrorCheckAndLog(this,"glCopyNamedBufferSubData",0x501,
                              " if the source and destination are the same buffer object, and the ranges [readOffset,readOffset+size) and [writeOffset,writeOffset+size) overlap."
                             );
  (*this->m_pMapNamedBuffer)(buffer_r,35000);
  dVar7 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar7,"glMapNamedBuffer failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0xcb8);
  (*this->m_pCopyNamedBufferSubData)(buffer_r,buffer_w,0,0,4);
  local_3d = ErrorCheckAndLog(this,"glCopyNamedBufferSubData",0x502,
                              " if the source buffer object is mapped with MapBuffer.");
  (*this->m_pUnmapNamedBuffer)(buffer_r);
  dVar7 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar7,"glUnmapNamedBuffer failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0xcc0);
  (*this->m_pMapNamedBuffer)(buffer_w,35000);
  dVar7 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar7,"glMapNamedBuffer failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0xcc6);
  (*this->m_pCopyNamedBufferSubData)(buffer_r,buffer_w,0,0,4);
  local_3e = ErrorCheckAndLog(this,"glCopyNamedBufferSubData",0x502,
                              " if the destination buffer object is mapped with MapBuffer.");
  (*this->m_pUnmapNamedBuffer)(buffer_w);
  dVar7 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar7,"glUnmapNamedBuffer failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0xcce);
  (*this->m_pMapNamedBufferRange)(buffer_r,0,4,1);
  dVar7 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar7,"glMapNamedBuffer failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0xcd4);
  (*this->m_pCopyNamedBufferSubData)(buffer_r,buffer_w,0,0,4);
  local_3f = ErrorCheckAndLog(this,"glCopyNamedBufferSubData",0x502,
                              " if the source buffer object is mapped with MapBuffer.");
  (*this->m_pUnmapNamedBuffer)(buffer_r);
  dVar7 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar7,"glUnmapNamedBuffer failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0xcdc);
  (*this->m_pMapNamedBufferRange)(buffer_w,0,4,1);
  dVar7 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar7,"glMapNamedBuffer failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0xce2);
  (*this->m_pCopyNamedBufferSubData)(buffer_r,buffer_w,0,0,4);
  bVar3 = ErrorCheckAndLog(this,"glCopyNamedBufferSubData",0x502,
                           " if the destination buffer object is mapped with MapBuffer.");
  (*this->m_pUnmapNamedBuffer)(buffer_w);
  dVar7 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar7,"glUnmapNamedBuffer failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0xcea);
  (*this->m_pMapNamedBufferRange)(buffer_r,0,4,0x41);
  dVar7 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar7,"glMapNamedBuffer failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0xcf1);
  (*this->m_pCopyNamedBufferSubData)(buffer_r,buffer_w,0,0,4);
  bVar4 = ErrorCheckAndLog(this,"glCopyNamedBufferSubData",0,
                           " if the source buffer object is mapped using MapBufferRange with the MAP_PERSISTENT bit set in the access flags."
                          );
  (*this->m_pUnmapNamedBuffer)(buffer_r);
  dVar7 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar7,"glUnmapNamedBuffer failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0xcfb);
  (*this->m_pMapNamedBufferRange)(buffer_w,0,4,0x41);
  dVar7 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar7,"glMapNamedBuffer failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0xd02);
  (*this->m_pCopyNamedBufferSubData)(buffer_r,buffer_w,0,0,4);
  dVar7 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar7,"glMapNamedBuffer failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0xd06);
  bVar5 = ErrorCheckAndLog(this,"glCopyNamedBufferSubData",0,
                           " if the destination buffer object is mapped using MapBufferRange with the MAP_PERSISTENT bit set in the access flags."
                          );
  (*this->m_pUnmapNamedBuffer)(buffer_w);
  dVar7 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar7,"glUnmapNamedBuffer failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0xd0d);
  bVar9 = bVar2 & local_35 & local_36 & local_37 & local_38 & local_39 & local_3a & local_3b &
          local_3c & local_3d & local_3e & local_3f;
  if (buffer_r != 0) {
    (**(code **)(lVar8 + 0x438))(1,&buffer_r);
  }
  return (bool)(bVar9 & bVar3 & bVar4 & bVar5);
}

Assistant:

bool ErrorsTest::TestErrorsOfCopyNamedBufferSubData()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Return value. */
	bool is_ok			= true;
	bool internal_error = false;

	/* Common variables. */
	glw::GLuint  buffer_r	  = 0;
	glw::GLuint  buffer_w	  = 0;
	glw::GLubyte dummy_data[4] = {};

	try
	{
		/* Common preparations. */
		gl.createBuffers(1, &buffer_r);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateBuffers failed.");

		m_pNamedBufferStorage(buffer_r, sizeof(dummy_data), &dummy_data,
							  GL_MAP_READ_BIT | GL_MAP_WRITE_BIT | GL_MAP_PERSISTENT_BIT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glNamedBuffeStorage failed.");

		gl.createBuffers(1, &buffer_w);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateBuffers failed.");

		m_pNamedBufferStorage(buffer_w, sizeof(dummy_data), &dummy_data,
							  GL_MAP_READ_BIT | GL_MAP_WRITE_BIT | GL_MAP_PERSISTENT_BIT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glNamedBuffeStorage failed.");

		/* Test invalid buffer name error behavior. */
		{
			/* Prepare for invalid buffer name error behavior verification. */
			glw::GLuint not_a_buffer_name = 0;

			while (gl.isBuffer(++not_a_buffer_name))
				;

			/* Test. */
			m_pCopyNamedBufferSubData(not_a_buffer_name, buffer_w, 0, 0, sizeof(dummy_data));

			is_ok &= ErrorCheckAndLog("glCopyNamedBufferSubData", GL_INVALID_OPERATION,
									  " if readBuffer is not the name of an existing buffer object.");

			m_pCopyNamedBufferSubData(buffer_r, not_a_buffer_name, 0, 0, sizeof(dummy_data));

			is_ok &= ErrorCheckAndLog("glCopyNamedBufferSubData", GL_INVALID_OPERATION,
									  " if writeBuffer is not the name of an existing buffer object.");
		}

		/* Test negative read offset error behavior. */
		{
			/* Test. */
			m_pCopyNamedBufferSubData(buffer_r, buffer_w, -1, 0, sizeof(dummy_data));

			is_ok &= ErrorCheckAndLog("glCopyNamedBufferSubData", GL_INVALID_VALUE, "if readOffset is negative.");
		}

		/* Test negative write offset error behavior. */
		{
			/* Test. */
			m_pCopyNamedBufferSubData(buffer_r, buffer_w, 0, -1, sizeof(dummy_data));

			is_ok &= ErrorCheckAndLog("glCopyNamedBufferSubData", GL_INVALID_VALUE, "if writeOffset is negative.");
		}

		/* Test negative size error behavior. */
		{
			/* Test. */
			m_pCopyNamedBufferSubData(buffer_r, buffer_w, 0, 0, -1);

			is_ok &= ErrorCheckAndLog("glCopyNamedBufferSubData", GL_INVALID_VALUE, "if size is negative.");
		}

		/* Test overflow size error behavior. */
		{
			/* Test. */
			m_pCopyNamedBufferSubData(buffer_r, buffer_w, 0, 0, 2 * sizeof(dummy_data));

			is_ok &= ErrorCheckAndLog("glCopyNamedBufferSubData", GL_INVALID_VALUE,
									  " if size is greater than the size of the source buffer object.");
		}

		/* Test overflow read offset and size error behavior. */
		{
			/* Test. */
			m_pCopyNamedBufferSubData(buffer_r, buffer_w, sizeof(dummy_data) / 2, 0, sizeof(dummy_data));

			is_ok &= ErrorCheckAndLog("glCopyNamedBufferSubData", GL_INVALID_VALUE,
									  " if readOffset+size is greater than the size of the source buffer object.");
		}

		/* Test overflow write offset and size error behavior. */
		{
			/* Test. */
			m_pCopyNamedBufferSubData(buffer_r, buffer_w, 0, sizeof(dummy_data) / 2, sizeof(dummy_data));

			is_ok &= ErrorCheckAndLog("glCopyNamedBufferSubData", GL_INVALID_VALUE,
									  " if writeOffset+size is greater than the size of the source buffer object.");
		}

		/* Test same buffer overlapping error behavior. */
		{
			/* Test. */
			m_pCopyNamedBufferSubData(buffer_w, buffer_w, 0, 0, sizeof(dummy_data));

			is_ok &= ErrorCheckAndLog("glCopyNamedBufferSubData", GL_INVALID_VALUE,
									  " if the source and destination are the same buffer object, and the ranges"
									  " [readOffset,readOffset+size) and [writeOffset,writeOffset+size) overlap.");
		}

		/* Test of mapped read buffer copy error behavior verification (glMapNamedBuffer version). */
		{
			(void)(glw::GLbyte*) m_pMapNamedBuffer(buffer_r, GL_READ_ONLY);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glMapNamedBuffer failed.");

			m_pCopyNamedBufferSubData(buffer_r, buffer_w, 0, 0, sizeof(dummy_data));

			is_ok &= ErrorCheckAndLog("glCopyNamedBufferSubData", GL_INVALID_OPERATION,
									  " if the source buffer object is mapped with MapBuffer.");

			m_pUnmapNamedBuffer(buffer_r);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapNamedBuffer failed.");
		}

		/* Test of mapped write buffer copy error behavior verification (glMapNamedBuffer version). */
		{
			(void)(glw::GLbyte*) m_pMapNamedBuffer(buffer_w, GL_READ_ONLY);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glMapNamedBuffer failed.");

			m_pCopyNamedBufferSubData(buffer_r, buffer_w, 0, 0, sizeof(dummy_data));

			is_ok &= ErrorCheckAndLog("glCopyNamedBufferSubData", GL_INVALID_OPERATION,
									  " if the destination buffer object is mapped with MapBuffer.");

			m_pUnmapNamedBuffer(buffer_w);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapNamedBuffer failed.");
		}

		/* Test of mapped read buffer copy error behavior verification (glMapNamedBufferRange version). */
		{
			(void)(glw::GLbyte*) m_pMapNamedBufferRange(buffer_r, 0, sizeof(dummy_data), GL_MAP_READ_BIT);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glMapNamedBuffer failed.");

			m_pCopyNamedBufferSubData(buffer_r, buffer_w, 0, 0, sizeof(dummy_data));

			is_ok &= ErrorCheckAndLog("glCopyNamedBufferSubData", GL_INVALID_OPERATION,
									  " if the source buffer object is mapped with MapBuffer.");

			m_pUnmapNamedBuffer(buffer_r);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapNamedBuffer failed.");
		}

		/* Test of mapped write buffer copy error behavior verification (glMapNamedBufferRange version). */
		{
			(void)(glw::GLbyte*) m_pMapNamedBufferRange(buffer_w, 0, sizeof(dummy_data), GL_MAP_READ_BIT);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glMapNamedBuffer failed.");

			m_pCopyNamedBufferSubData(buffer_r, buffer_w, 0, 0, sizeof(dummy_data));

			is_ok &= ErrorCheckAndLog("glCopyNamedBufferSubData", GL_INVALID_OPERATION,
									  " if the destination buffer object is mapped with MapBuffer.");

			m_pUnmapNamedBuffer(buffer_w);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapNamedBuffer failed.");
		}

		/* Test of persistently mapped read buffer copy error with behavior verification. */
		{
			(void)(glw::GLbyte*)
				m_pMapNamedBufferRange(buffer_r, 0, sizeof(dummy_data), GL_MAP_READ_BIT | GL_MAP_PERSISTENT_BIT);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glMapNamedBuffer failed.");

			m_pCopyNamedBufferSubData(buffer_r, buffer_w, 0, 0, sizeof(dummy_data));

			is_ok &= ErrorCheckAndLog("glCopyNamedBufferSubData", GL_NO_ERROR,
									  " if the source buffer object is mapped using "
									  "MapBufferRange with the MAP_PERSISTENT bit "
									  "set in the access flags.");

			m_pUnmapNamedBuffer(buffer_r);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapNamedBuffer failed.");
		}

		/* Test of persistently mapped write buffer copy error with behavior verification. */
		{
			(void)(glw::GLbyte*)
				m_pMapNamedBufferRange(buffer_w, 0, sizeof(dummy_data), GL_MAP_READ_BIT | GL_MAP_PERSISTENT_BIT);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glMapNamedBuffer failed.");

			m_pCopyNamedBufferSubData(buffer_r, buffer_w, 0, 0, sizeof(dummy_data));

			GLU_EXPECT_NO_ERROR(gl.getError(), "glMapNamedBuffer failed.");
			is_ok &= ErrorCheckAndLog("glCopyNamedBufferSubData", GL_NO_ERROR,
									  " if the destination buffer object is mapped using "
									  "MapBufferRange with the MAP_PERSISTENT bit "
									  "set in the access flags.");

			m_pUnmapNamedBuffer(buffer_w);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapNamedBuffer failed.");
		}
	}
	catch (...)
	{
		is_ok		   = false;
		internal_error = true;
	}

	if (buffer_r)
	{
		gl.deleteBuffers(1, &buffer_r);

		buffer_r = 0;
	}

	if (buffer_r)
	{
		gl.deleteBuffers(1, &buffer_r);

		buffer_r = 0;
	}

	if (internal_error)
	{
		throw 0;
	}

	return is_ok;
}